

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O3

void sexp_release_object(sexp_conflict ctx,sexp_conflict x)

{
  sexp psVar1;
  sexp_conflict *ppsVar2;
  sexp_conflict *ppsVar3;
  sexp_mark_stack_ptr_t *psVar4;
  sexp_conflict *ppsVar5;
  
  psVar1 = (ctx->value).type.setters;
  ppsVar2 = (psVar1->value).context.mark_stack[8].start;
  if (((ulong)ppsVar2 & 3) == 0) {
    ppsVar5 = (sexp_conflict *)0x0;
    do {
      ppsVar3 = ppsVar2;
      if (*(int *)ppsVar3 != 6) {
        return;
      }
      if (ppsVar3[1] == x) {
        psVar4 = (sexp_mark_stack_ptr_t *)(ppsVar5 + 2);
        if (ppsVar5 == (sexp_conflict *)0x0) {
          psVar4 = (psVar1->value).context.mark_stack + 8;
        }
        psVar4->start = (sexp_conflict *)ppsVar3[2];
        return;
      }
      ppsVar2 = (sexp_conflict *)ppsVar3[2];
      ppsVar5 = ppsVar3;
    } while (((ulong)ppsVar3[2] & 3) == 0);
  }
  return;
}

Assistant:

void sexp_release_object(sexp ctx, sexp x) {
  sexp ls1, ls2;
  for (ls1=NULL, ls2=sexp_global(ctx, SEXP_G_PRESERVATIVES); sexp_pairp(ls2);
       ls1=ls2, ls2=sexp_cdr(ls2))
    if (sexp_car(ls2) == x) {
      if (ls1) sexp_cdr(ls1) = sexp_cdr(ls2);
      else sexp_global(ctx, SEXP_G_PRESERVATIVES) = sexp_cdr(ls2);
      break;
    }
}